

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_seeking.c
# Opt level: O3

int check_rsi_seek(test_state *state)

{
  int iVar1;
  ulong uVar2;
  ulong uVar4;
  uchar *puVar5;
  uchar *puVar3;
  
  if (0 < (long)state->buf_len) {
    iVar1 = state->bytes_per_sample;
    puVar3 = state->ubuf;
    puVar5 = puVar3;
    do {
      uVar2 = (long)puVar3 - (long)puVar5;
      uVar4 = uVar2 + 0x3f;
      if (-1 < (long)uVar2) {
        uVar4 = uVar2;
      }
      (*state->out)(puVar5,((uVar4 & 0xffffffffffffffc0) - uVar2) + state->xmax,iVar1);
      (*state->out)(puVar5 + iVar1,state->xmin,iVar1);
      puVar5 = puVar5 + (long)state->bytes_per_sample * 2;
      puVar3 = state->ubuf;
    } while (puVar5 < puVar3 + state->buf_len);
  }
  printf("Checking seeking ... ");
  iVar1 = check_block_sizes_seek(state);
  if (iVar1 == 0) {
    puts("\x1b[0;32mPASS\x1b[0m");
  }
  return iVar1;
}

Assistant:

int check_rsi_seek(struct test_state *state)
{
    int status;
    int size = state->bytes_per_sample;

    for (unsigned char *tmp = state->ubuf;
         tmp < state->ubuf + state->buf_len;
         tmp += 2 * state->bytes_per_sample) {
        state->out(tmp, state->xmax - ((state->ubuf - tmp) % 64), size);
        state->out(tmp + size, state->xmin, size);
    }

    printf("Checking seeking ... ");
    status = check_block_sizes_seek(state);
    if (status)
        return status;

    printf ("%s\n", CHECK_PASS);
    return 0;
}